

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O2

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::ConsiderIntegrality
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
           *this)

{
  PLApproxParams *pPVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double y;
  
  pPVar1 = this->laPrm_;
  if ((pPVar1->is_x_int == true) && (pPVar1->fUsePeriod == false)) {
    dVar6 = (pPVar1->grDomOut).ubx;
    dVar5 = ceil((pPVar1->grDomOut).lbx);
    dVar6 = floor(dVar6);
    iVar3 = (int)((dVar6 - dVar5) + 1.0);
    if (iVar3 <= (int)((ulong)((long)(pPVar1->plPoints).x_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pPVar1->plPoints).x_.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3)) {
      PLPoints::clear(&pPVar1->plPoints);
      iVar2 = 0;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      dVar6 = 0.0;
      while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
        pPVar1 = this->laPrm_;
        (*this->_vptr_BasicPLApproximator[9])(this);
        PLPoints::AddPoint(&pPVar1->plPoints,dVar5 + dVar6,y);
        dVar6 = dVar6 + 1.0;
      }
    }
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ConsiderIntegrality() {
  /// Simple case when N breakpoints >= N integer points
  if (laPrm_.is_x_int && !laPrm_.fUsePeriod) {
    auto x0=std::ceil(laPrm_.grDomOut.lbx);
    auto xN=std::floor(laPrm_.grDomOut.ubx);
    auto N = int(xN - x0 + 1);
    if (N <= laPrm_.plPoints.size()) {
      laPrm_.plPoints.clear();
      for (int k=0; k<N; ++k)       // use double + int
        laPrm_.plPoints.AddPoint(x0+k, eval(x0+k));
    }
  }
}